

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O0

Token * __thiscall EOPlus::Lexer::ReadSymbol(Token *__return_storage_ptr__,Lexer *this)

{
  char __c;
  bool bVar1;
  allocator<char> local_f1;
  string local_f0;
  variant local_d0;
  variant local_90;
  function<bool_(char)> local_40;
  char local_19;
  Lexer *pLStack_18;
  char c;
  Lexer *this_local;
  
  local_19 = '\0';
  pLStack_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  std::function<bool(char)>::function<bool(&)(char),void>
            ((function<bool(char)> *)&local_40,ctype_symbol);
  bVar1 = GetCharIf(this,&local_19,&local_40);
  std::function<bool_(char)>::~function(&local_40);
  __c = local_19;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,1,__c,&local_f1);
    util::variant::variant(&local_d0,&local_f0);
    Token::Token(__return_storage_ptr__,Symbol,&local_d0);
    util::variant::~variant(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  else {
    util::variant::variant(&local_90);
    Token::Token(__return_storage_ptr__,Invalid,&local_90);
    util::variant::~variant(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadSymbol()
	{
		char c = '\0';

		if (!this->GetCharIf(c, ctype_symbol))
			return Token();

		return Token(Token::Symbol, std::string(1, c));
	}